

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::LifetimeTests::details::FboOutputAttacher::drawAttachment
          (FboOutputAttacher *this,GLuint element,Surface *dst)

{
  Context *ctx;
  ostringstream *this_00;
  Attacher *pAVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Framebuffer fbo;
  ObjectWrapper OStack_1b8;
  MessageBuilder local_1a0;
  
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&OStack_1b8,
             (this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx);
  pAVar1 = (this->super_OutputAttacher).m_attacher;
  (pAVar1->super_ContextWrapper).super_CallLogWrapper.m_enableLog = false;
  (*pAVar1->_vptr_Attacher[1])(pAVar1,element,(ulong)OStack_1b8.m_object);
  ctx = &(this->super_OutputAttacher).super_ContextWrapper.m_ctx;
  drawFbo(ctx,OStack_1b8.m_object,dst);
  pAVar1 = (this->super_OutputAttacher).m_attacher;
  (*pAVar1->_vptr_Attacher[2])(pAVar1,element,(ulong)OStack_1b8.m_object);
  (((this->super_OutputAttacher).m_attacher)->super_ContextWrapper).super_CallLogWrapper.m_enableLog
       = true;
  local_1a0.m_log = ((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"// Read pixels from ");
  iVar2 = (*((this->super_OutputAttacher).m_attacher)->m_elementType->_vptr_Type[7])();
  std::operator<<((ostream *)this_00,(char *)CONCAT44(extraout_var,iVar2));
  std::operator<<((ostream *)this_00," ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00," to output image.");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar2 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x145);
  glu::ObjectWrapper::~ObjectWrapper(&OStack_1b8);
  return;
}

Assistant:

void FboOutputAttacher::drawAttachment (GLuint element, Surface& dst)
{
	Framebuffer fbo(getRenderContext());
	m_attacher.enableLogging(false);
	m_attacher.attach(element, *fbo);
	drawFbo(getContext(), *fbo, dst);
	m_attacher.detach(element, *fbo);
	m_attacher.enableLogging(true);
	log() << TestLog::Message
		  << "// Read pixels from " << m_attacher.getElementType().getName() << " " << element
		  << " to output image."
		  << TestLog::EndMessage;
	GLU_CHECK_ERROR(gl().getError());
}